

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReturnValues.cc
# Opt level: O3

void __thiscall Calculator::execute(Calculator *this)

{
  long *plVar1;
  int sum;
  int local_24;
  anon_class_8_1_ba1d79ab local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Calculating..",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  local_20.sum = &local_24;
  local_24 = 0;
  sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::operator()
            ((BasicSignal<int(),std::lock_guard<std::mutex>> *)this,&local_20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Sum of calculation: ",0x14);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_24);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void execute()
  {
    std::cout << "Calculating.." << std::endl;

    int sum = 0;
    executeSignal_([&sum](int retVal) {
      std::cout << "Incoming value: " << retVal << std::endl;
      sum += retVal;
    });

    std::cout << "Sum of calculation: " << sum << std::endl;
  }